

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_lock.c
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = mtx_init(&g_mutex,0);
  if (iVar1 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
           ,0x3b,"mtx_init( &g_mutex, mtx_plain ) == thrd_success");
  }
  lVar2 = 0;
  do {
    iVar1 = thrd_create((thrd_t *)((long)g_thread + lVar2),func,(void *)0x0);
    if (iVar1 != 1) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
             ,0x3f,"thrd_create( &g_thread[i], func, NULL ) == thrd_success");
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x50);
  lVar2 = 0;
  do {
    iVar1 = thrd_join(*(thrd_t *)((long)g_thread + lVar2),(int *)0x0);
    if (iVar1 != 1) {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/threads/mtx_lock.c, line %d - %s\n"
             ,0x44,"thrd_join( g_thread[i], NULL ) == thrd_success");
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x50);
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( mtx_init( &g_mutex, mtx_plain ) == thrd_success );

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_create( &g_thread[i], func, NULL ) == thrd_success );
    }

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_join( g_thread[i], NULL ) == thrd_success );
    }

#endif
    return TEST_RESULTS;
}